

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.hpp
# Opt level: O1

string * __thiscall Pcode::ToString_abi_cxx11_(string *__return_storage_ptr__,Pcode *this)

{
  size_t __n;
  long lVar1;
  int iVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ulong *puVar8;
  bool bVar9;
  allocator local_191;
  ulong *local_190;
  long local_188;
  ulong local_180;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined8 *local_170;
  size_t local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  undefined8 uStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_170 = &local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"");
  __n = (this->m_comment)._M_string_length;
  if (__n == local_168) {
    if (__n == 0) {
      bVar9 = true;
    }
    else {
      iVar2 = bcmp((this->m_comment)._M_dataplus._M_p,local_170,__n);
      bVar9 = iVar2 == 0;
    }
  }
  else {
    bVar9 = false;
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (!bVar9) {
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\t","");
    plVar4 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_90,0,(char *)0x0,
                                (ulong)(this->m_num1)._M_dataplus._M_p);
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_c0 = *puVar8;
      lStack_b8 = plVar4[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *puVar8;
      local_d0 = (ulong *)*plVar4;
    }
    local_c8 = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)(this->m_num2)._M_dataplus._M_p);
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_a0 = *puVar8;
      uStack_98 = (undefined4)plVar4[3];
      uStack_94 = *(undefined4 *)((long)plVar4 + 0x1c);
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *puVar8;
      local_b0 = (ulong *)*plVar4;
    }
    local_a8 = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_110 = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"\t","");
    uVar7 = 0xf;
    if (local_b0 != &local_a0) {
      uVar7 = local_a0;
    }
    if (uVar7 < (ulong)(local_108 + local_a8)) {
      uVar7 = 0xf;
      if (local_110 != local_100) {
        uVar7 = local_100[0];
      }
      if (uVar7 < (ulong)(local_108 + local_a8)) goto LAB_0013865c;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_b0);
    }
    else {
LAB_0013865c:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_110);
    }
    local_130 = &local_120;
    puVar8 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar8) {
      local_120 = *puVar8;
      uStack_118 = puVar3[3];
    }
    else {
      local_120 = *puVar8;
      local_130 = (ulong *)*puVar3;
    }
    local_128 = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)puVar8 = 0;
    std::__cxx11::string::string((string *)&local_50,pcode_string[this->m_op],&local_191);
    uVar7 = 0xf;
    if (local_130 != &local_120) {
      uVar7 = local_120;
    }
    if (uVar7 < (ulong)(local_48 + local_128)) {
      uVar7 = 0xf;
      if (local_50 != local_40) {
        uVar7 = local_40[0];
      }
      if (uVar7 < (ulong)(local_48 + local_128)) goto LAB_00138822;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_130);
    }
    else {
LAB_00138822:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_50);
    }
    local_190 = &local_180;
    puVar8 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar8) {
      local_180 = *puVar8;
      uStack_178 = *(undefined4 *)(puVar3 + 3);
      uStack_174 = *(undefined4 *)((long)puVar3 + 0x1c);
    }
    else {
      local_180 = *puVar8;
      local_190 = (ulong *)*puVar3;
    }
    local_188 = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)puVar8 = 0;
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\t","");
    uVar7 = 0xf;
    if (local_190 != &local_180) {
      uVar7 = local_180;
    }
    if (uVar7 < (ulong)(local_68 + local_188)) {
      uVar7 = 0xf;
      if (local_70 != local_60) {
        uVar7 = local_60[0];
      }
      if (uVar7 < (ulong)(local_68 + local_188)) goto LAB_001389fd;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_190);
    }
    else {
LAB_001389fd:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_70);
    }
    local_150 = &local_140;
    puVar8 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar8) {
      local_140 = *puVar8;
      uStack_138 = puVar3[3];
    }
    else {
      local_140 = *puVar8;
      local_150 = (ulong *)*puVar3;
    }
    local_148 = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)puVar8 = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_150,(ulong)(this->m_num3)._M_dataplus._M_p);
    puVar8 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar8) {
      local_e0 = *puVar8;
      uStack_d8 = puVar3[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar8;
      local_f0 = (ulong *)*puVar3;
    }
    local_e8 = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
    puVar6 = puVar3 + 2;
    if ((undefined8 *)*puVar3 == puVar6) {
      local_160 = *puVar6;
      uStack_158 = puVar3[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *puVar6;
      local_170 = (undefined8 *)*puVar3;
    }
    local_168 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_170,(ulong)(this->m_comment)._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar1 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_170 != &local_160) {
      operator_delete(local_170);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130);
    }
    if (local_110 != local_100) {
      operator_delete(local_110);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    puVar8 = local_90;
    if (local_90 == local_80) {
      return __return_storage_ptr__;
    }
    goto LAB_00138b6a;
  }
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\t","");
  puVar3 = (undefined8 *)
           std::__cxx11::string::replace
                     ((ulong)&local_b0,0,(char *)0x0,(ulong)(this->m_num1)._M_dataplus._M_p);
  local_130 = &local_120;
  puVar8 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar8) {
    local_120 = *puVar8;
    uStack_118 = puVar3[3];
  }
  else {
    local_120 = *puVar8;
    local_130 = (ulong *)*puVar3;
  }
  local_128 = puVar3[1];
  *puVar3 = puVar8;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_130,(ulong)(this->m_num2)._M_dataplus._M_p);
  puVar8 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar8) {
    local_180 = *puVar8;
    uStack_178 = *(undefined4 *)(puVar3 + 3);
    uStack_174 = *(undefined4 *)((long)puVar3 + 0x1c);
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar8;
    local_190 = (ulong *)*puVar3;
  }
  local_188 = puVar3[1];
  *puVar3 = puVar8;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\t","");
  uVar7 = 0xf;
  if (local_190 != &local_180) {
    uVar7 = local_180;
  }
  if (uVar7 < (ulong)(local_c8 + local_188)) {
    uVar7 = 0xf;
    if (local_d0 != &local_c0) {
      uVar7 = local_c0;
    }
    if (uVar7 < (ulong)(local_c8 + local_188)) goto LAB_001385a8;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_001385a8:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_d0);
  }
  local_150 = &local_140;
  puVar8 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar8) {
    local_140 = *puVar8;
    uStack_138 = puVar3[3];
  }
  else {
    local_140 = *puVar8;
    local_150 = (ulong *)*puVar3;
  }
  local_148 = puVar3[1];
  *puVar3 = puVar8;
  puVar3[1] = 0;
  *(undefined1 *)puVar8 = 0;
  std::__cxx11::string::string((string *)&local_90,pcode_string[this->m_op],(allocator *)&local_50);
  uVar7 = 0xf;
  if (local_150 != &local_140) {
    uVar7 = local_140;
  }
  if (uVar7 < (ulong)(local_88 + local_148)) {
    uVar7 = 0xf;
    if (local_90 != local_80) {
      uVar7 = local_80[0];
    }
    if (uVar7 < (ulong)(local_88 + local_148)) goto LAB_00138742;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_00138742:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_90);
  }
  local_f0 = &local_e0;
  puVar8 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar8) {
    local_e0 = *puVar8;
    uStack_d8 = puVar3[3];
  }
  else {
    local_e0 = *puVar8;
    local_f0 = (ulong *)*puVar3;
  }
  local_e8 = puVar3[1];
  *puVar3 = puVar8;
  puVar3[1] = 0;
  *(undefined1 *)puVar8 = 0;
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"\t","");
  uVar7 = 0xf;
  if (local_f0 != &local_e0) {
    uVar7 = local_e0;
  }
  if (uVar7 < (ulong)(local_108 + local_e8)) {
    uVar7 = 0xf;
    if (local_110 != local_100) {
      uVar7 = local_100[0];
    }
    if (uVar7 < (ulong)(local_108 + local_e8)) goto LAB_00138917;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_00138917:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110);
  }
  local_170 = &local_160;
  puVar6 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar6) {
    local_160 = *puVar6;
    uStack_158 = puVar3[3];
  }
  else {
    local_160 = *puVar6;
    local_170 = (undefined8 *)*puVar3;
  }
  local_168 = puVar3[1];
  *puVar3 = puVar6;
  puVar3[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_170,(ulong)(this->m_num3)._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar1 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  puVar8 = local_b0;
  if (local_b0 == &local_a0) {
    return __return_storage_ptr__;
  }
LAB_00138b6a:
  operator_delete(puVar8);
  return __return_storage_ptr__;
}

Assistant:

string ToString() {
        if (m_comment == string(""))
            return m_num1 + string("\t") + m_num2 + string("\t") + string(pcode_string[m_op]) + string("\t") + m_num3;
        else
            return m_num1 + string("\t") + m_num2 + string("\t") + string(pcode_string[m_op]) + string("\t") + m_num3 + "\t" + m_comment;
    }